

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::ExtensionRange::CopyTo
          (ExtensionRange *this,DescriptorProto_ExtensionRange *proto)

{
  int32 iVar1;
  uint uVar2;
  ExtensionRangeOptions *pEVar3;
  ExtensionRangeOptions *pEVar4;
  Arena *arena;
  
  iVar1 = this->start;
  uVar2 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar2 | 2;
  proto->start_ = iVar1;
  iVar1 = this->end;
  (proto->_has_bits_).has_bits_[0] = uVar2 | 6;
  proto->end_ = iVar1;
  pEVar3 = this->options_;
  pEVar4 = ExtensionRangeOptions::default_instance();
  if (pEVar3 != pEVar4) {
    pEVar3 = this->options_;
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
    if (proto->options_ == (ExtensionRangeOptions *)0x0) {
      arena = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      pEVar4 = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(arena);
      proto->options_ = pEVar4;
    }
    ExtensionRangeOptions::CopyFrom(proto->options_,pEVar3);
    return;
  }
  return;
}

Assistant:

void Descriptor::ExtensionRange::CopyTo(
    DescriptorProto_ExtensionRange* proto) const {
  proto->set_start(this->start);
  proto->set_end(this->end);
  if (options_ != &ExtensionRangeOptions::default_instance()) {
    *proto->mutable_options() = *options_;
  }
}